

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_listen_without_bind(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *loop;
  uv_tcp_t server;
  sockaddr_in sStack_338;
  uv_buf_t uStack_328;
  undefined1 auStack_318 [328];
  undefined1 auStack_1d0 [192];
  void *pvStack_110;
  uv_tcp_t local_100;
  
  pvStack_110 = (void *)0x16de4c;
  puVar2 = uv_default_loop();
  pvStack_110 = (void *)0x16de59;
  iVar1 = uv_tcp_init(puVar2,&local_100);
  if (iVar1 == 0) {
    pvStack_110 = (void *)0x16de6e;
    iVar1 = uv_listen((uv_stream_t *)&local_100,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0016deb6;
    pvStack_110 = (void *)0x16de77;
    unaff_RBX = uv_default_loop();
    pvStack_110 = (void *)0x16de8b;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pvStack_110 = (void *)0x16de95;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pvStack_110 = (void *)0x16de9a;
    puVar2 = uv_default_loop();
    pvStack_110 = (void *)0x16dea2;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pvStack_110 = (void *)0x16deb6;
    run_test_tcp_listen_without_bind_cold_1();
LAB_0016deb6:
    pvStack_110 = (void *)0x16debb;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pvStack_110 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  loop = "0.0.0.0";
  pvStack_110 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_338);
  if (iVar1 == 0) {
    loop = (char *)uv_default_loop();
    iVar1 = uv_tcp_init((uv_loop_t *)loop,(uv_tcp_t *)auStack_318);
    if (iVar1 != 0) goto LAB_0016e03a;
    loop = auStack_318;
    iVar1 = uv_tcp_bind((uv_tcp_t *)loop,(sockaddr *)&sStack_338,0);
    if (iVar1 != 0) goto LAB_0016e03f;
    loop = auStack_318;
    iVar1 = uv_listen((uv_stream_t *)loop,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0016e044;
    loop = auStack_318;
    iVar1 = uv_is_writable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0016e049;
    loop = auStack_318;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0016e04e;
    uStack_328 = uv_buf_init("PING",4);
    loop = auStack_1d0;
    iVar1 = uv_write((uv_write_t *)loop,(uv_stream_t *)auStack_318,&uStack_328,1,(uv_write_cb)0x0);
    if (iVar1 != -0x20) goto LAB_0016e053;
    loop = auStack_318 + 0xf8;
    iVar1 = uv_shutdown((uv_shutdown_t *)loop,(uv_stream_t *)auStack_318,(uv_shutdown_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0016e058;
    loop = auStack_318;
    iVar1 = uv_read_start((uv_stream_t *)loop,(uv_alloc_cb)0x0,(uv_read_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0016e05d;
    uv_close((uv_handle_t *)auStack_318,close_cb);
    loop = (char *)uv_default_loop();
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016e067;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0016e03a:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0016e03f:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_0016e044:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_0016e049:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0016e04e:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_0016e053:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_0016e058:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_0016e05d:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_0016e067:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_listen_without_bind) {
  int r;
  uv_tcp_t server;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}